

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void LowererMD::LegalizeSrc<false>(Instr *instr,Opnd *src,LegalForms forms)

{
  Var address;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  AddrOpndKind kind;
  LegalForms LVar4;
  IRType IVar5;
  OpCode assignOpcode;
  int iVar6;
  undefined4 *puVar7;
  Opnd *pOVar8;
  IntConstOpnd *this;
  IntConstOpnd *largeConstOpnd;
  Int64ConstOpnd *pIVar9;
  long lVar10;
  RegOpnd *dstOpnd;
  AddrOpnd *this_00;
  AddrOpnd *largeConstOpnd_00;
  Func *pFVar11;
  MemRefOpnd *opnd;
  IndirOpnd *pIVar12;
  Instr *pIVar13;
  bool local_c1;
  Instr *hoistInstr;
  bool equalsSrc2;
  OpCode loadOpCode;
  MemRefOpnd *memRefOpnd;
  IndirOpnd *indirOpnd_1;
  AddrOpnd *newAddrOpnd;
  AddrOpnd *addrOpnd;
  Instr *moveToReg;
  Opnd *regOpnd;
  Int64ConstOpnd *int64Opnd;
  IndirOpnd *indirOpnd;
  IntConstOpnd *newIntOpnd;
  IntConstOpnd *intOpnd;
  IndirOpnd *pIStack_18;
  LegalForms forms_local;
  Opnd *src_local;
  Instr *instr_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x807,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (src == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x808,"(src)","src");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pOVar8 = IR::Instr::GetSrc1(instr);
  if ((src != pOVar8) && (pOVar8 = IR::Instr::GetSrc2(instr), src != pOVar8)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x809,"(src == instr->GetSrc1() || src == instr->GetSrc2())",
                       "src == instr->GetSrc1() || src == instr->GetSrc2()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = operator!(forms);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x80a,"(forms)","forms");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  OVar3 = IR::Opnd::GetKind(src);
  pIStack_18 = (IndirOpnd *)src;
  switch(OVar3) {
  case OpndKindIntConst:
    LVar4 = ::operator&(forms,L_Ptr);
    if (LVar4 != L_None) {
      return;
    }
    this = IR::Opnd::AsIntConstOpnd(src);
    IVar5 = IR::Opnd::GetType(&this->super_Opnd);
    if (TySize[IVar5] == 8) {
      if ((*(ushort *)&instr->field_0x36 >> 5 & 1) == 0) {
        lVar10 = IR::EncodableOpnd<long>::GetValue(&this->super_EncodableOpnd<long>);
        bVar2 = Math::FitsInDWord(lVar10);
        if (bVar2) goto LAB_00899b3a;
      }
      if ((*(ushort *)&instr->field_0x36 >> 5 & 1) == 0) {
        LVar4 = ::operator&(forms,L_Reg);
        bVar2 = operator!(LVar4);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                             ,0x82f,"(forms & L_Reg)","forms & L_Reg");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        pOVar8 = IR::Opnd::Copy(&this->super_Opnd,instr->m_func);
        largeConstOpnd = IR::Opnd::AsIntConstOpnd(pOVar8);
        pFVar11 = Func::GetTopFunc(instr->m_func);
        lVar10 = IR::EncodableOpnd<long>::GetValue(&this->super_EncodableOpnd<long>);
        pIVar12 = Func::GetConstantAddressIndirOpnd
                            (pFVar11,lVar10,&largeConstOpnd->super_Opnd,AddrOpndKindConstantAddress,
                             TyUint64,MOV);
        bVar2 = HoistLargeConstant(pIVar12,src,instr);
        if (bVar2) {
          return;
        }
      }
      break;
    }
LAB_00899b3a:
    LVar4 = ::operator&(forms,L_Imm32);
    goto joined_r0x0089a05c;
  case OpndKindInt64Const:
    LVar4 = ::operator&(forms,L_Ptr);
    if (LVar4 != L_None) {
      return;
    }
    pIVar9 = IR::Opnd::AsInt64ConstOpnd(src);
    LVar4 = ::operator&(forms,L_Imm32);
    if (LVar4 != L_None) {
      iVar6 = IR::Opnd::GetSize(src);
      if (iVar6 != 8) {
        return;
      }
      if ((*(ushort *)&instr->field_0x36 >> 5 & 1) == 0) {
        lVar10 = IR::EncodableOpnd<long>::GetValue(&pIVar9->super_EncodableOpnd<long>);
        bVar2 = Math::FitsInDWord(lVar10);
        if (bVar2) {
          return;
        }
      }
    }
    LVar4 = ::operator&(forms,L_Reg);
    bVar2 = operator!(LVar4);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x851,"(forms & L_Reg)","forms & L_Reg");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    IVar5 = IR::Opnd::GetType(src);
    dstOpnd = IR::RegOpnd::New(IVar5,instr->m_func);
    pIVar13 = IR::Instr::New(MOV,&dstOpnd->super_Opnd,src,instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar13);
    IR::Instr::ReplaceSrc(instr,src,&dstOpnd->super_Opnd);
    return;
  case OpndKindFloatConst:
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x899,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
    break;
  case OpndKindHelperCall:
  case OpndKindLabel:
    if ((*(ushort *)&instr->field_0x36 >> 5 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x894,"(!instr->isInlineeEntryInstr)","!instr->isInlineeEntryInstr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    LVar4 = ::operator&(forms,L_Ptr);
    bVar2 = operator!(LVar4);
    if (!bVar2) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x895,"(forms & L_Ptr)","forms & L_Ptr");
    if (bVar2) {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
      return;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case OpndKindReg:
    LVar4 = ::operator&(forms,L_Reg);
    bVar2 = operator!(LVar4);
    if (!bVar2) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x811,"(forms & L_Reg)","forms & L_Reg");
    if (bVar2) {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
      return;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case OpndKindAddr:
    LVar4 = ::operator&(forms,L_Ptr);
    if (LVar4 != L_None) {
      return;
    }
    this_00 = IR::Opnd::AsAddrOpnd(src);
    LVar4 = ::operator&(forms,L_Imm32);
    if (LVar4 != L_None) {
      IVar5 = IR::Opnd::GetType(&this_00->super_Opnd);
      if (TySize[IVar5] != 8) {
        return;
      }
      if (((*(ushort *)&instr->field_0x36 >> 5 & 1) == 0) &&
         (bVar2 = Math::FitsInDWord((size_t)this_00->m_address), bVar2)) {
        return;
      }
    }
    if ((*(ushort *)&instr->field_0x36 >> 5 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x86e,"(!instr->isInlineeEntryInstr)","!instr->isInlineeEntryInstr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    LVar4 = ::operator&(forms,L_Reg);
    bVar2 = operator!(LVar4);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x86f,"(forms & L_Reg)","forms & L_Reg");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pOVar8 = IR::Opnd::Copy(&this_00->super_Opnd,instr->m_func);
    largeConstOpnd_00 = IR::Opnd::AsAddrOpnd(pOVar8);
    pFVar11 = Func::GetTopFunc(instr->m_func);
    address = this_00->m_address;
    kind = IR::AddrOpnd::GetAddrOpndKind(this_00);
    pIVar12 = Func::GetConstantAddressIndirOpnd
                        (pFVar11,(intptr_t)address,&largeConstOpnd_00->super_Opnd,kind,TyUint64,MOV)
    ;
    bVar2 = HoistLargeConstant(pIVar12,src,instr);
    if (bVar2) {
      return;
    }
    break;
  case OpndKindMemRef:
    opnd = IR::Opnd::AsMemRefOpnd(src);
    bVar2 = LowererMDArch::IsLegalMemLoc(opnd);
    if (!bVar2) {
      pIStack_18 = IR::Instr::HoistMemRefAddress(instr,opnd,MOV);
    }
  case OpndKindSym:
  case OpndKindIndir:
    LVar4 = ::operator&(forms,L_Mem);
joined_r0x0089a05c:
    if (LVar4 != L_None) {
      return;
    }
  }
  LVar4 = ::operator&(forms,L_Reg);
  bVar2 = operator!(LVar4);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x8a4,"(forms & L_Reg)","forms & L_Reg");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pOVar8 = IR::Instr::GetDst(instr);
  if (pOVar8 != (Opnd *)0x0) {
    pOVar8 = IR::Instr::GetDst(instr);
    bVar2 = IR::Opnd::IsEqual(pOVar8,&pIStack_18->super_Opnd);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x8a5,"(!(instr->GetDst() && instr->GetDst()->IsEqual(src)))",
                         "!(instr->GetDst() && instr->GetDst()->IsEqual(src))");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
  }
  IVar5 = IR::Opnd::GetType(&pIStack_18->super_Opnd);
  assignOpcode = GetLoadOp(IVar5);
  pIVar12 = (IndirOpnd *)IR::Instr::GetSrc2(instr);
  if (pIStack_18 == pIVar12) {
    IR::Instr::HoistSrc2(instr,assignOpcode,RegNOREG,(StackSym *)0x0);
  }
  else {
    pOVar8 = IR::Instr::GetSrc2(instr);
    local_c1 = false;
    if (pOVar8 != (Opnd *)0x0) {
      pOVar8 = IR::Instr::GetSrc2(instr);
      local_c1 = IR::Opnd::IsEqual(&pIStack_18->super_Opnd,pOVar8);
    }
    pIVar13 = IR::Instr::HoistSrc1(instr,assignOpcode,RegNOREG,(StackSym *)0x0);
    if (local_c1 != false) {
      pOVar8 = IR::Instr::GetDst(pIVar13);
      IR::Instr::ReplaceSrc2(instr,pOVar8);
    }
    *(ushort *)&pIVar13->field_0x36 =
         *(ushort *)&pIVar13->field_0x36 & 0xffdf | (*(ushort *)&instr->field_0x36 >> 5 & 1) << 5;
    *(ushort *)&instr->field_0x36 = *(ushort *)&instr->field_0x36 & 0xffdf;
  }
  return;
}

Assistant:

void LowererMD::LegalizeSrc(IR::Instr *const instr, IR::Opnd *src, const LegalForms forms)
{
    Assert(instr);
    Assert(src);
    Assert(src == instr->GetSrc1() || src == instr->GetSrc2());
    Assert(forms);
#ifndef _M_X64
    AssertMsg(!src->IsInt64() || src->IsMemoryOpnd(), "Int64 supported only on x64");
#endif
    switch(src->GetKind())
    {
        case IR::OpndKindReg:
            Assert(forms & L_Reg);
            return;

        case IR::OpndKindIntConst:
            if(forms & L_Ptr)
            {
                return;
            }
#ifdef _M_X64
            {
                IR::IntConstOpnd * intOpnd = src->AsIntConstOpnd();
                if ((TySize[intOpnd->GetType()] != 8) ||
                    (!instr->isInlineeEntryInstr && Math::FitsInDWord(intOpnd->GetValue())))
                {
                    if (forms & L_Imm32)
                    {
                        // the constant fits in 32-bit, no need to hoist
                        return;
                    }
                    break;
                }
                if (verify)
                {
                    AssertMsg(false, "IntConstOpnd doesn't fit in 32 bits. Missing legalization");
                    return;
                }
                // The actual value for inlinee entry instr isn't determined until encoder
                // So it need to be hoisted conventionally.
                if (!instr->isInlineeEntryInstr)
                {
                    Assert(forms & L_Reg);
                    IR::IntConstOpnd * newIntOpnd = intOpnd->Copy(instr->m_func)->AsIntConstOpnd();
                    IR::IndirOpnd * indirOpnd = instr->m_func->GetTopFunc()->GetConstantAddressIndirOpnd(intOpnd->GetValue(), newIntOpnd, IR::AddrOpndKindConstantAddress, TyMachPtr, Js::OpCode::MOV);
                    if (HoistLargeConstant(indirOpnd, src, instr))
                    {
                        return;
                    }
                }
            }
#endif
            break;
        case IR::OpndKindFloatConst:
            break; // assume for now that it always needs to be hoisted

        case IR::OpndKindInt64Const:
            if (forms & L_Ptr)
            {
                return;
            }
#ifdef _M_X64
            {
                IR::Int64ConstOpnd * int64Opnd = src->AsInt64ConstOpnd();
                if ((forms & L_Imm32) && ((src->GetSize() != 8) ||
                    (!instr->isInlineeEntryInstr && Math::FitsInDWord(int64Opnd->GetValue()))))
                {
                    // the immediate fits in 32-bit, no need to hoist
                    return;
                }
                if (verify)
                {
                    AssertMsg(false, "Int64ConstOpnd doesn't fit in 32 bits. Missing legalization");
                    return;
                }

                Assert(forms & L_Reg);
                IR::Opnd* regOpnd = IR::RegOpnd::New(src->GetType(), instr->m_func);
                IR::Instr* moveToReg = IR::Instr::New(Js::OpCode::MOV, regOpnd, src, instr->m_func);
                instr->InsertBefore(moveToReg);
                instr->ReplaceSrc(src, regOpnd);
                return;
            }
#endif
            break;
        case IR::OpndKindAddr:
            if (forms & L_Ptr)
            {
                return;
            }
#ifdef _M_X64
            {
                IR::AddrOpnd * addrOpnd = src->AsAddrOpnd();
                if ((forms & L_Imm32) && ((TySize[addrOpnd->GetType()] != 8) ||
                    (!instr->isInlineeEntryInstr && Math::FitsInDWord((size_t)addrOpnd->m_address))))
                {
                    // the address fits in 32-bit, no need to hoist
                    return;
                }
                if (verify)
                {
                    AssertMsg(false, "AddrOpnd doesn't fit in 32 bits. Missing legalization");
                    return;
                }

                Assert(!instr->isInlineeEntryInstr);
                Assert(forms & L_Reg);
                // TODO: michhol, remove cast after making m_address intptr
                IR::AddrOpnd * newAddrOpnd = addrOpnd->Copy(instr->m_func)->AsAddrOpnd();
                IR::IndirOpnd * indirOpnd = instr->m_func->GetTopFunc()->GetConstantAddressIndirOpnd((intptr_t)addrOpnd->m_address, newAddrOpnd, addrOpnd->GetAddrOpndKind(), TyMachPtr, Js::OpCode::MOV);
                if (HoistLargeConstant(indirOpnd, src, instr))
                {
                    return;
                }
            }
#endif
            break;

        case IR::OpndKindMemRef:
        {
            IR::MemRefOpnd *const memRefOpnd = src->AsMemRefOpnd();
            if(!LowererMDArch::IsLegalMemLoc(memRefOpnd))
            {
                if (verify)
                {
                    AssertMsg(false, "Memory reference not legal in src opnd. Missing legalization");
                    return;
                }
                src = instr->HoistMemRefAddress(memRefOpnd, Js::OpCode::MOV);
            }
            // fall through
        }

        case IR::OpndKindSym:
        case IR::OpndKindIndir:
            if(forms & L_Mem)
            {
                return;
            }
            break;

        case IR::OpndKindHelperCall:
        case IR::OpndKindLabel:
            Assert(!instr->isInlineeEntryInstr);
            Assert(forms & L_Ptr);
            return;

        default:
            Assert(false);
            __assume(false);
    }

    if (verify)
    {
        AssertMsg(false, "Src opnd not legal. Missing legalization");
        return;
    }

    // Hoist the src into a reg
    Assert(forms & L_Reg);
    Assert(!(instr->GetDst() && instr->GetDst()->IsEqual(src)));
    const Js::OpCode loadOpCode = GetLoadOp(src->GetType());
    if(src == instr->GetSrc2())
    {
        instr->HoistSrc2(loadOpCode);
        return;
    }
    const bool equalsSrc2 = instr->GetSrc2() && src->IsEqual(instr->GetSrc2());
    IR::Instr * hoistInstr = instr->HoistSrc1(loadOpCode);
    if(equalsSrc2)
    {
        instr->ReplaceSrc2(hoistInstr->GetDst());
    }
    hoistInstr->isInlineeEntryInstr = instr->isInlineeEntryInstr;
    instr->isInlineeEntryInstr = false;
}